

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint addChunk_PLTE(ucvector *out,LodePNGColorMode *info)

{
  uint uVar1;
  uchar *puVar2;
  size_t sVar3;
  uchar *chunk;
  
  if (info->palettesize - 0x101 < 0xffffffffffffff00) {
    uVar1 = 0x44;
  }
  else {
    uVar1 = lodepng_chunk_init(&chunk,out,info->palettesize * 3,"PLTE");
    if (uVar1 == 0) {
      puVar2 = chunk + 10;
      for (sVar3 = 0; sVar3 != info->palettesize; sVar3 = sVar3 + 1) {
        puVar2[-2] = info->palette[sVar3 * 4];
        puVar2[-1] = info->palette[sVar3 * 4 + 1];
        *puVar2 = info->palette[sVar3 * 4 + 2];
        puVar2 = puVar2 + 3;
      }
      lodepng_chunk_generate_crc(chunk);
      uVar1 = 0;
    }
  }
  return uVar1;
}

Assistant:

static unsigned addChunk_PLTE(ucvector* out, const LodePNGColorMode* info) {
  unsigned char* chunk;
  size_t i, j = 8;

  if(info->palettesize == 0 || info->palettesize > 256) {
    return 68; /*invalid palette size, it is only allowed to be 1-256*/
  }

  CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, info->palettesize * 3, "PLTE"));

  for(i = 0; i != info->palettesize; ++i) {
    /*add all channels except alpha channel*/
    chunk[j++] = info->palette[i * 4 + 0];
    chunk[j++] = info->palette[i * 4 + 1];
    chunk[j++] = info->palette[i * 4 + 2];
  }

  lodepng_chunk_generate_crc(chunk);
  return 0;
}